

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O0

bool __thiscall ui::Renderable::hovers(Renderable *this,Point p)

{
  Point a;
  bool bVar1;
  Point *pPVar2;
  bool local_71;
  Point local_58;
  Point local_50;
  Point local_48;
  Point local_40;
  Point local_38;
  Point local_30;
  Point local_28;
  Point t;
  Renderable *this_local;
  Point p_local;
  
  if ((this->_hoverable & 1U) == 0) {
    p_local.x._3_1_ = false;
  }
  else {
    local_38 = p;
    t = (Point)this;
    pPVar2 = Area::origin(&this->super_Area);
    local_40 = *pPVar2;
    local_30 = ui::operator-(local_38,local_40);
    pPVar2 = Area::padding(&this->super_Area);
    local_48 = *pPVar2;
    local_28 = ui::operator-(local_30,local_48);
    if (this->_root != this) {
      pPVar2 = Area::origin(&this->_root->super_Area);
      Point::operator-=(&local_28,pPVar2);
    }
    local_50.x = 0.0;
    local_50.y = 0.0;
    bVar1 = Point::operator>=(&local_28,&local_50);
    local_71 = false;
    if (bVar1) {
      pPVar2 = Area::dimension(&this->super_Area);
      a = *pPVar2;
      pPVar2 = Area::padding(&this->super_Area);
      local_58 = ui::operator-(a,*pPVar2);
      local_71 = Point::operator<=(&local_28,&local_58);
    }
    if (local_71 == false) {
      p_local.x._3_1_ = false;
    }
    else {
      p_local.x._3_1_ = true;
    }
  }
  return p_local.x._3_1_;
}

Assistant:

bool hovers(Point p) {
            if(_hoverable == false) return false;
            Point t = p - origin() - padding();
            if(_root != this) t -= _root->origin();
            if(t >= Point {0, 0} && t <= dimension() - padding()) {
                return true;
            }
            return false;
        }